

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zetCommandListAppendMetricQueryBegin
          (zet_command_list_handle_t hCommandList,zet_metric_query_handle_t hMetricQuery)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  size_type sStack_88;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  zet_pfnCommandListAppendMetricQueryBegin_t pfnAppendMetricQueryBegin;
  allocator local_41;
  string local_40 [32];
  zet_metric_query_handle_t local_20;
  zet_metric_query_handle_t hMetricQuery_local;
  zet_command_list_handle_t hCommandList_local;
  
  local_20 = hMetricQuery;
  hMetricQuery_local = (zet_metric_query_handle_t)hCommandList;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"zetCommandListAppendMetricQueryBegin(hCommandList, hMetricQuery)",&local_41);
  loader::Logger::log_trace(this,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pcVar1 = *(code **)(context + 0x700);
  if (pcVar1 == (code *)0x0) {
    hCommandList_local._4_4_ =
         logAndPropagateResult
                   ("zetCommandListAppendMetricQueryBegin",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zetValidation->_vptr_ZETValidationEntryPoints[0x3a])
                        ((*ppvVar4)->zetValidation,hMetricQuery_local,local_20);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetCommandListAppendMetricQueryBegin",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      zVar2 = ZETHandleLifetimeValidation::zetCommandListAppendMetricQueryBeginPrologue
                        (&pHVar5->zetHandleLifetime,(zet_command_list_handle_t)hMetricQuery_local,
                         local_20);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetCommandListAppendMetricQueryBegin",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(hMetricQuery_local,local_20);
    for (sStack_88 = 0; sStack_88 < sVar3; sStack_88 = sStack_88 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_88);
      result_00 = (*(*ppvVar4)->zetValidation->_vptr_ZETValidationEntryPoints[0x3b])
                            ((*ppvVar4)->zetValidation,hMetricQuery_local,local_20,(ulong)zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zetCommandListAppendMetricQueryBegin",result_00);
        return zVar2;
      }
    }
    hCommandList_local._4_4_ = logAndPropagateResult("zetCommandListAppendMetricQueryBegin",zVar2);
  }
  return hCommandList_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetCommandListAppendMetricQueryBegin(
        zet_command_list_handle_t hCommandList,         ///< [in] handle of the command list
        zet_metric_query_handle_t hMetricQuery          ///< [in] handle of the metric query
        )
    {
        context.logger->log_trace("zetCommandListAppendMetricQueryBegin(hCommandList, hMetricQuery)");

        auto pfnAppendMetricQueryBegin = context.zetDdiTable.CommandList.pfnAppendMetricQueryBegin;

        if( nullptr == pfnAppendMetricQueryBegin )
            return logAndPropagateResult("zetCommandListAppendMetricQueryBegin", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetCommandListAppendMetricQueryBeginPrologue( hCommandList, hMetricQuery );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetCommandListAppendMetricQueryBegin", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetCommandListAppendMetricQueryBeginPrologue( hCommandList, hMetricQuery );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetCommandListAppendMetricQueryBegin", result);
        }

        auto driver_result = pfnAppendMetricQueryBegin( hCommandList, hMetricQuery );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetCommandListAppendMetricQueryBeginEpilogue( hCommandList, hMetricQuery ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetCommandListAppendMetricQueryBegin", result);
        }

        return logAndPropagateResult("zetCommandListAppendMetricQueryBegin", driver_result);
    }